

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

String * __thiscall
nigel::IMC_Generator::operatorToString_abi_cxx11_
          (String *__return_storage_ptr__,IMC_Generator *this,shared_ptr<nigel::IM_Operator> *op)

{
  char cVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  char *__lhs;
  char *local_268;
  allocator local_1c1;
  undefined1 local_1c0 [16];
  string local_1b0;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  string local_170;
  byte local_149;
  undefined1 local_148 [16];
  undefined1 local_138 [32];
  undefined1 local_118 [23];
  allocator local_101;
  undefined1 local_100 [24];
  undefined1 local_e8 [24];
  undefined1 local_d0 [24];
  undefined1 local_b8 [24];
  undefined1 local_a0 [32];
  string local_80;
  undefined1 local_50 [16];
  string local_40;
  shared_ptr<nigel::IM_Operator> *local_20;
  shared_ptr<nigel::IM_Operator> *op_local;
  IMC_Generator *this_local;
  
  local_20 = op;
  op_local = (shared_ptr<nigel::IM_Operator> *)this;
  this_local = (IMC_Generator *)__return_storage_ptr__;
  peVar3 = std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)op);
  if (peVar3->type == constant) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               op);
    IM_Operator::as<nigel::IM_Constant>((IM_Operator *)local_50);
    peVar4 = std::__shared_ptr_access<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    helper::int_to_hex<unsigned_char>
              ((string *)(local_50 + 0x10),(peVar4->super_IM_Operator).field_0x1c);
    std::operator+(__return_storage_ptr__,"#",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_50 + 0x10));
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
    std::shared_ptr<nigel::IM_Constant>::~shared_ptr((shared_ptr<nigel::IM_Constant> *)local_50);
  }
  else {
    peVar3 = std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)op);
    if (peVar3->type == variable) {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)op);
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_a0 + 0x10));
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(local_a0 + 0x10));
      std::__cxx11::to_string(&local_80,peVar5->id);
      std::operator+(__return_storage_ptr__,"v",&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                ((shared_ptr<nigel::IM_Variable> *)(local_a0 + 0x10));
    }
    else {
      peVar3 = std::
               __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)op);
      if (peVar3->type == sfr) {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)op);
        IM_Operator::as<nigel::IM_SFR>((IM_Operator *)local_a0);
        peVar6 = std::__shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a0);
        cVar1 = (peVar6->super_IM_Operator).field_0x1c;
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr((shared_ptr<nigel::IM_SFR> *)local_a0);
        if (cVar1 == -0x20) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"A",(allocator *)(local_b8 + 0x17));
          std::allocator<char>::~allocator((allocator<char> *)(local_b8 + 0x17));
        }
        else {
          std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)op);
          IM_Operator::as<nigel::IM_SFR>((IM_Operator *)local_b8);
          peVar6 = std::__shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_b8);
          cVar1 = (peVar6->super_IM_Operator).field_0x1c;
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr((shared_ptr<nigel::IM_SFR> *)local_b8);
          if (cVar1 == -0x10) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"B",(allocator *)(local_d0 + 0x17));
            std::allocator<char>::~allocator((allocator<char> *)(local_d0 + 0x17));
          }
          else {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)op);
            IM_Operator::as<nigel::IM_SFR>((IM_Operator *)local_d0);
            peVar6 = std::
                     __shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d0);
            cVar1 = (peVar6->super_IM_Operator).field_0x1c;
            std::shared_ptr<nigel::IM_SFR>::~shared_ptr((shared_ptr<nigel::IM_SFR> *)local_d0);
            if (cVar1 == -0x7f) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,"SP",(allocator *)(local_e8 + 0x17));
              std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x17));
            }
            else {
              std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)op);
              IM_Operator::as<nigel::IM_SFR>((IM_Operator *)local_e8);
              peVar6 = std::
                       __shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_e8);
              cVar1 = (peVar6->super_IM_Operator).field_0x1c;
              std::shared_ptr<nigel::IM_SFR>::~shared_ptr((shared_ptr<nigel::IM_SFR> *)local_e8);
              if (cVar1 == '\a') {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"BR",(allocator *)(local_100 + 0x17));
                std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0x17));
              }
              else {
                std::
                __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)op);
                IM_Operator::as<nigel::IM_SFR>((IM_Operator *)local_100);
                peVar6 = std::
                         __shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::IM_SFR,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_100);
                cVar1 = (peVar6->super_IM_Operator).field_0x1c;
                std::shared_ptr<nigel::IM_SFR>::~shared_ptr((shared_ptr<nigel::IM_SFR> *)local_100);
                if (cVar1 == '\x06') {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)__return_storage_ptr__,"SW",&local_101);
                  std::allocator<char>::~allocator((allocator<char> *)&local_101);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,"-!-UNKNOWN_SFR-!-",
                             (allocator *)(local_118 + 0x16));
                  std::allocator<char>::~allocator((allocator<char> *)(local_118 + 0x16));
                }
              }
            }
          }
        }
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)op);
        if (peVar3->type == block) {
          std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)op);
          IM_Operator::as<nigel::IM_Block>((IM_Operator *)local_118);
          peVar7 = std::
                   __shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_118);
          bVar2 = std::operator!=(&peVar7->symbol,"");
          std::shared_ptr<nigel::IM_Block>::~shared_ptr((shared_ptr<nigel::IM_Block> *)local_118);
          if (bVar2) {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)op);
            IM_Operator::as<nigel::IM_Block>((IM_Operator *)(local_138 + 0x10));
            peVar7 = std::
                     __shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(local_138 + 0x10));
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&peVar7->symbol)
            ;
            std::shared_ptr<nigel::IM_Block>::~shared_ptr
                      ((shared_ptr<nigel::IM_Block> *)(local_138 + 0x10));
          }
          else {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)op);
            IM_Operator::as<nigel::IM_Block>((IM_Operator *)local_138);
            peVar7 = std::
                     __shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_138);
            local_149 = 0;
            if ((peVar7->begin & 1U) == 0) {
              std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)op);
              IM_Operator::as<nigel::IM_Block>((IM_Operator *)local_148);
              local_149 = 1;
              peVar7 = std::
                       __shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_148);
              local_268 = "end";
              if ((peVar7->finish & 1U) != 0) {
                local_268 = "finish";
              }
            }
            else {
              local_268 = "begin";
            }
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)op);
            IM_Operator::as<nigel::IM_Block>((IM_Operator *)local_180);
            peVar7 = std::
                     __shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_180);
            std::__cxx11::to_string
                      ((string *)(local_180 + 0x10),*(uint *)&(peVar7->super_IM_Operator).field_0x1c
                      );
            std::operator+(__return_storage_ptr__,local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_180 + 0x10));
            std::__cxx11::string::~string((string *)(local_180 + 0x10));
            std::shared_ptr<nigel::IM_Block>::~shared_ptr((shared_ptr<nigel::IM_Block> *)local_180);
            if ((local_149 & 1) != 0) {
              std::shared_ptr<nigel::IM_Block>::~shared_ptr
                        ((shared_ptr<nigel::IM_Block> *)local_148);
            }
            std::shared_ptr<nigel::IM_Block>::~shared_ptr((shared_ptr<nigel::IM_Block> *)local_138);
          }
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)op);
          if (peVar3->type == condition) {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)op);
            IM_Operator::as<nigel::IM_Condition>((IM_Operator *)local_190);
            peVar8 = std::
                     __shared_ptr_access<nigel::IM_Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_190);
            __lhs = "false";
            if ((peVar8->isTrue & 1U) != 0) {
              __lhs = "true";
            }
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)op);
            IM_Operator::as<nigel::IM_Condition>((IM_Operator *)local_1c0);
            peVar8 = std::
                     __shared_ptr_access<nigel::IM_Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1c0);
            std::__cxx11::to_string
                      ((string *)(local_1c0 + 0x10),*(uint *)&(peVar8->super_IM_Operator).field_0x1c
                      );
            std::operator+(__return_storage_ptr__,__lhs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_1c0 + 0x10));
            std::__cxx11::string::~string((string *)(local_1c0 + 0x10));
            std::shared_ptr<nigel::IM_Condition>::~shared_ptr
                      ((shared_ptr<nigel::IM_Condition> *)local_1c0);
            std::shared_ptr<nigel::IM_Condition>::~shared_ptr
                      ((shared_ptr<nigel::IM_Condition> *)local_190);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"-!-UNKNOWN-!-",&local_1c1);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String IMC_Generator::operatorToString( std::shared_ptr<IM_Operator> op )
	{
		if( op->type == IM_Operator::Type::constant ) return "#" + int_to_hex( op->as<IM_Constant>()->data );
		else if( op->type == IM_Operator::Type::variable ) return "v" + to_string( op->as<IM_Variable>()->id );
		else if( op->type == IM_Operator::Type::sfr )
		{
			if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::A ) ) return "A";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::B ) ) return "B";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::SP ) ) return "SP";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::BR ) ) return "BR";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::SW ) ) return "SW";
			else return "-!-UNKNOWN_SFR-!-";
		}
		else if( op->type == IM_Operator::Type::block )
		{
			if( op->as<IM_Block>()->symbol != "" ) return op->as<IM_Block>()->symbol;
			else return ( op->as<IM_Block>()->begin ? "begin" : op->as<IM_Block>()->finish ? "finish" : "end" ) + to_string( op->as<IM_Block>()->blockID );
		}
		else if( op->type == IM_Operator::Type::condition )
			return ( op->as<IM_Condition>()->isTrue ? "true" : "false" ) + to_string( op->as<IM_Condition>()->conditionID );
		else return "-!-UNKNOWN-!-";
	}